

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameObservers.cpp
# Opt level: O0

string * center(string *__return_storage_ptr__,string *str,int width)

{
  int iVar1;
  ostream *poVar2;
  string local_388 [32];
  string local_368 [36];
  int local_344;
  int local_340;
  int i;
  int padding;
  stringstream local_330 [8];
  stringstream spaces;
  ostream local_320 [376];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [380];
  int local_1c;
  string *psStack_18;
  int width_local;
  string *str_local;
  
  local_1c = width;
  psStack_18 = str;
  str_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__cxx11::stringstream::stringstream(local_330);
  iVar1 = local_1c;
  local_340 = std::__cxx11::string::size();
  local_340 = iVar1 - local_340;
  for (local_344 = 0; local_344 < local_340 / 2; local_344 = local_344 + 1) {
    std::operator<<(local_320," ");
  }
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<(local_198,local_368);
  poVar2 = std::operator<<(poVar2,(string *)psStack_18);
  std::__cxx11::stringstream::str();
  std::operator<<(poVar2,local_388);
  std::__cxx11::string::~string(local_388);
  std::__cxx11::string::~string(local_368);
  if ((0 < local_340) && (local_340 % 2 != 0)) {
    std::operator<<(local_198," ");
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_330);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string center(const string& str, const int width) {
    stringstream ss, spaces;
    int padding = width - str.size();                 // count excess room to pad
    for (int i = 0; i < padding / 2; ++i)
        spaces << " ";
    ss << spaces.str() << str << spaces.str();    // format with padding
    if (padding > 0 && padding % 2 != 0)               // if odd #, add 1 space
        ss << " ";
    return ss.str();
}